

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O1

void __thiscall Expression::adjustOperators(Expression *this)

{
  ulong uVar1;
  _Elt_pointer ppEVar2;
  ExpressionSymbol *pEVar3;
  _Map_pointer pppEVar4;
  _Elt_pointer ppEVar5;
  _Elt_pointer ppEVar6;
  long lVar7;
  _Elt_pointer ppEVar8;
  ulong uVar9;
  _Elt_pointer ppEVar10;
  
  ppEVar5 = (this->m_symbols)._deque.
            super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppEVar6 = (this->m_symbols)._deque.
            super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_first;
  pppEVar4 = (this->m_symbols)._deque.
             super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  lVar7 = (long)ppEVar5 - (long)ppEVar6 >> 3;
  uVar1 = lVar7 + 1;
  if (uVar1 < 0x40) {
    ppEVar8 = (this->m_symbols)._deque.
              super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppEVar5 = ppEVar5 + 1;
  }
  else {
    uVar9 = uVar1 >> 6 | 0xfc00000000000000;
    if (-1 < lVar7) {
      uVar9 = uVar1 >> 6;
    }
    pppEVar4 = pppEVar4 + uVar9;
    ppEVar6 = *pppEVar4;
    ppEVar8 = ppEVar6 + 0x40;
    ppEVar5 = ppEVar6 + uVar1 + uVar9 * -0x40;
  }
  ppEVar2 = (this->m_symbols)._deque.
            super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  while (ppEVar5 != ppEVar2) {
    pEVar3 = *ppEVar5;
    if ((pEVar3->m_type == EXPRSYM_Operator) && ((char)pEVar3[1].m_type == EXPRSYM_Value)) {
      lVar7 = (long)ppEVar5 - (long)ppEVar6 >> 3;
      uVar1 = lVar7 - 1;
      if (uVar1 < 0x40) {
        ppEVar10 = ppEVar5 + -1;
      }
      else {
        uVar9 = uVar1 >> 6 | 0xfc00000000000000;
        if (1 < lVar7) {
          uVar9 = uVar1 >> 6;
        }
        ppEVar10 = pppEVar4[uVar9] + uVar1 + uVar9 * -0x40;
      }
      if ((*ppEVar10)->m_type == EXPRSYM_Value) {
        *(undefined1 *)&pEVar3[1].m_type = 6;
      }
    }
    ppEVar5 = ppEVar5 + 1;
    if (ppEVar5 == ppEVar8) {
      ppEVar5 = pppEVar4[1];
      pppEVar4 = pppEVar4 + 1;
      ppEVar8 = ppEVar5 + 0x40;
      ppEVar6 = ppEVar5;
    }
  }
  return;
}

Assistant:

void Expression::adjustOperators()
{
	for (auto it = m_symbols.begin() + 1; it != m_symbols.end(); ++it)
	{
		if ((*it)->type() != EXPRSYM_Operator)
			continue;

		ExpressionOperator* op = static_cast<ExpressionOperator*> (*it);

		// Unary minus with a value as the previous symbol cannot really be
		// unary; replace with binary minus.
		if (op->id() == OPER_UnaryMinus and (*(it - 1))->type() == EXPRSYM_Value)
			op->setID (OPER_Subtraction);
	}
}